

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

FILE * cmsys::SystemTools::Fopen(string *file,char *mode)

{
  char *__filename;
  FILE *pFVar1;
  char *mode_local;
  string *file_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen64(__filename,mode);
  return (FILE *)pFVar1;
}

Assistant:

FILE* SystemTools::Fopen(const kwsys_stl::string& file, const char* mode)
{
#ifdef _WIN32
  return _wfopen(SystemTools::ConvertToWindowsExtendedPath(file).c_str(),
                 Encoding::ToWide(mode).c_str());
#else
  return fopen(file.c_str(), mode);
#endif
}